

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileExpr(jx9_gen_state *pGen,sxi32 iFlags,
                    _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xTreeValidator)

{
  int iVar1;
  uint uVar2;
  SyToken *pSVar3;
  jx9_vm *pjVar4;
  jx9_expr_node *pjVar5;
  ProcNodeConstruct p_Var6;
  undefined8 uVar7;
  long lVar8;
  sxi32 sVar9;
  int iVar10;
  SyToken *pSVar11;
  undefined8 *pSrc;
  jx9_expr_op *pjVar12;
  SyToken *pSVar13;
  code *pcVar14;
  char *pcVar15;
  sxu32 sVar16;
  ulong uVar17;
  int iVar18;
  SyToken *pSVar19;
  int iVar20;
  jx9_expr_node **apNode;
  SyToken *pSVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  uint local_94;
  SyToken *local_88;
  int local_7c;
  SyToken *local_78;
  sxi32 local_6c;
  undefined8 *local_68;
  _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *local_60;
  SySet local_58;
  
  local_58.pAllocator = &pGen->pVm->sAllocator;
  local_58.nUsed = 0;
  local_58.nSize = 0;
  local_58.eSize = 8;
  local_58.nCursor = 0;
  local_58.pBase = (jx9_expr_node **)0x0;
  local_58.pUserData = (void *)0x0;
  SySetAlloc(&local_58,0x10);
  pSVar3 = pGen->pEnd;
  iVar10 = 0;
  pSVar11 = pGen->pIn;
  for (pSVar21 = pSVar11; pSVar21 < pSVar3; pSVar21 = pSVar21 + 1) {
    uVar22 = pSVar21->nType;
    if ((uVar22 & 0x40) == 0) {
      if ((char)uVar22 < '\0') {
        iVar10 = iVar10 + -1;
      }
      else if (((uVar22 >> 0x12 & 1) != 0) && (iVar10 < 1)) break;
    }
    else {
      iVar10 = iVar10 + 1;
    }
  }
  iVar10 = 0;
  if (pSVar21 <= pSVar11) goto LAB_001227fd;
  pGen->pEnd = pSVar21;
  local_58._16_8_ = local_58._16_8_ & 0xffffffff00000000;
  local_58._24_8_ = local_58._24_8_ & 0xffffffff;
  local_68 = (undefined8 *)0x0;
  local_7c = 1;
  pSVar13 = pSVar21;
  local_6c = iFlags;
  local_60 = xTreeValidator;
  while (uVar7 = local_58._16_8_, apNode = (jx9_expr_node **)local_58.pBase, pSVar11 < pSVar13) {
    pSrc = (undefined8 *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x68);
    if (pSrc == (undefined8 *)0x0) {
      uVar22 = 0xffffffff;
LAB_00122750:
      apNode = (jx9_expr_node **)local_58.pBase;
      sVar16 = local_58.nUsed;
      goto LAB_001227a6;
    }
    SyZero(pSrc,0x68);
    pjVar4 = pGen->pVm;
    *(undefined4 *)(pSrc + 9) = 0;
    *(undefined4 *)((long)pSrc + 0x4c) = 0;
    *(undefined4 *)(pSrc + 10) = 8;
    *(undefined4 *)((long)pSrc + 0x54) = 0;
    pSrc[7] = pjVar4;
    pSrc[8] = 0;
    pSrc[0xb] = 0;
    local_88 = pGen->pIn;
    pSrc[3] = local_88;
    uVar22 = local_88->nType;
    if ((uVar22 & 0x20) != 0) {
      *pSrc = local_88->pUserData;
      goto LAB_00122219;
    }
    if ((uVar22 & 0x10) == 0) {
      if ((uVar22 & 0x40) == 0) {
        if ((uVar22 >> 0xb & 1) == 0) {
          if ((uVar22 & 4) != 0) {
            iVar10 = *(int *)&local_88->pUserData;
            if ((iVar10 - 0xdU < 4) || (iVar10 == 2)) {
              if (pGen->pEnd <= local_88 + 1) goto LAB_00122404;
              jx9DelimitNestedTokens(local_88,pGen->pEnd,0xa40,0x1480,&local_88);
              pSrc[6] = jx9CompileLangConstruct;
              pSVar11 = local_88;
              goto LAB_00122242;
            }
            if (iVar10 != 6) {
LAB_00122404:
              pSVar11 = local_88 + 1;
              pcVar14 = jx9CompileLiteral;
              goto LAB_0012223b;
            }
            pSVar11 = local_88 + 1;
            pSVar13 = pGen->pEnd;
            if (pSVar13 <= pSVar11) {
              pcVar14 = jx9CompileLiteral;
              goto LAB_001222fc;
            }
            sVar16 = local_88->nLine;
            pSVar19 = local_88 + 2;
            if ((local_88[1].nType & 0xc) == 0) {
              pSVar19 = pSVar11;
            }
            if ((pSVar13 <= pSVar19) || ((pSVar19->nType & 0x200) == 0)) {
              pcVar15 = "Missing opening parenthesis \'(\' while declaring annonymous function";
LAB_0012272d:
              iVar10 = jx9GenCompileError(pGen,1,sVar16,pcVar15);
              goto LAB_00122734;
            }
            local_78 = pSVar19 + 1;
            jx9DelimitNestedTokens(local_78,pSVar13,0x200,0x400,&local_78);
            if ((pSVar13 <= local_78) || (pSVar11 = local_78 + 1, pSVar13 <= pSVar11)) {
              pcVar15 = "Syntax error while declaring annonymous function";
              goto LAB_0012272d;
            }
            if ((local_78[1].nType & 0x40) != 0) {
              local_78 = local_78 + 2;
              jx9DelimitNestedTokens(local_78,pSVar13,0x40,0x80,&local_78);
              pSVar11 = local_78 + (local_78 < pSVar13);
LAB_00122459:
              pcVar14 = jx9CompileAnnonFunc;
              goto LAB_001222fc;
            }
            sVar9 = jx9GenCompileError(pGen,1,sVar16,
                                       "Syntax error while declaring annonymous function, missing \'{\'"
                                      );
            if (sVar9 != -10) goto LAB_00122459;
            uVar22 = 0xfffffff6;
LAB_00122745:
            SyMemBackendPoolFree(&pGen->pVm->sAllocator,pSrc);
            goto LAB_00122750;
          }
          if ((uVar22 & 8) != 0) goto LAB_00122404;
          if ((uVar22 & 0x121680) == 0) {
            pcVar14 = jx9CompileNumLiteral;
            if (((((uVar22 & 3) == 0) && (pcVar14 = jx9CompileString, (uVar22 >> 0xd & 1) == 0)) &&
                (pcVar14 = jx9CompileSimpleString, (uVar22 >> 0xe & 1) == 0)) &&
               (pcVar14 = jx9CompileNowdoc, (uVar22 >> 0x10 & 1) == 0)) {
              pSrc[6] = 0;
              iVar10 = jx9GenCompileError(pGen,1,local_88->nLine,
                                          "Syntax error: Unexpected token \'%z\'");
LAB_00122734:
              uVar22 = (uint)(iVar10 == -10) * 2 | 0xfffffff4;
              goto LAB_00122745;
            }
            pSrc[6] = pcVar14;
          }
LAB_00122219:
          pSVar11 = local_88 + 1;
          goto LAB_00122242;
        }
        local_88 = local_88 + 1;
        jx9DelimitNestedTokens(local_88,pGen->pEnd,0x800,0x1000,&local_88);
        if (pGen->pEnd <= local_88) {
          sVar16 = *(sxu32 *)(pSrc[3] + 0x14);
          pcVar15 = "JSON Array: Missing closing square bracket \']\'";
          goto LAB_0012272d;
        }
        pSVar11 = local_88 + 1;
        pcVar14 = jx9CompileJsonArray;
      }
      else {
        local_88 = local_88 + 1;
        jx9DelimitNestedTokens(local_88,pGen->pEnd,0x40,0x80,&local_88);
        if (pGen->pEnd <= local_88) {
          sVar16 = *(sxu32 *)(pSrc[3] + 0x14);
          pcVar15 = "JSON Object: Missing closing braces \'}\'";
          goto LAB_0012272d;
        }
        pSVar11 = local_88 + 1;
        pcVar14 = jx9CompileJsonObject;
      }
LAB_001222fc:
      pSrc[6] = pcVar14;
    }
    else {
      if (pGen->pEnd <= local_88 + 1) {
        sVar16 = local_88->nLine;
        pcVar15 = "Invalid variable name";
        goto LAB_0012272d;
      }
      pSVar11 = local_88 + 2;
      pcVar14 = jx9CompileVariable;
LAB_0012223b:
      pSrc[6] = pcVar14;
    }
LAB_00122242:
    pSrc[4] = pSVar11;
    pGen->pIn = pSVar11;
    local_68 = pSrc;
    SySetPut(&local_58,&local_68);
    pSVar13 = pGen->pEnd;
    pSVar11 = pGen->pIn;
  }
  sVar16 = local_58.nUsed;
  if (local_58.nUsed == 0) {
    sVar16 = 0;
    uVar22 = 0;
LAB_001227a6:
    local_7c = 0;
    local_94 = uVar22;
  }
  else {
    if (0 < (int)local_58.nUsed) {
      pjVar5 = *local_58.pBase;
      if ((pjVar5->pOp != (jx9_expr_op *)0x0) && ((pjVar5->pOp->iOp & 0xfffffffeU) == 0x10)) {
        pjVar12 = jx9ExprExtractOperator(&pjVar5->pStart->sData,(SyToken *)0x0);
        pjVar5->pOp = pjVar12;
        (*apNode)->pStart->pUserData = (*apNode)->pOp;
      }
    }
    local_94 = 0xfffffff6;
    uVar24 = 0;
    uVar17 = 0;
    if (0 < (int)sVar16) {
      uVar17 = uVar7 & 0xffffffff;
    }
    iVar20 = 0;
    iVar18 = 0;
    iVar10 = 0;
    for (; uVar24 != uVar17; uVar24 = uVar24 + 1) {
      pjVar5 = apNode[uVar24];
      pSVar11 = pjVar5->pStart;
      uVar22 = pSVar11->nType;
      if ((uVar22 >> 9 & 1) == 0) {
        if ((uVar22 >> 10 & 1) == 0) {
          if (((uVar22 >> 0xb & 1) == 0) || (pjVar5->xCode != (ProcNodeConstruct)0x0)) {
            if ((uVar22 >> 0xc & 1) == 0) {
              if (((uVar22 & 0x40) == 0) || (pjVar5->xCode != (ProcNodeConstruct)0x0)) {
                if ((char)uVar22 < '\0') {
                  if (iVar10 < 1) {
                    pcVar15 = "Syntax error: Unexpected token \'}\'";
                    goto LAB_00122781;
                  }
                  iVar10 = iVar10 + -1;
                }
                else if ((((uVar24 != 0) && ((uVar22 & 0x20) != 0)) &&
                         (iVar1 = pjVar5->pOp->iOp, iVar1 - 7U < 2)) &&
                        (apNode[uVar24 - 1]->xCode == jx9CompileVariable ||
                         apNode[uVar24 - 1]->xCode == jx9CompileLiteral)) {
                  lVar8 = 0;
                  do {
                    lVar23 = lVar8;
                    if (lVar23 + 0x20 == 0x660) break;
                    lVar8 = lVar23 + 0x20;
                  } while (*(uint *)((long)&aOpTable[0].iOp + lVar23) != (iVar1 == 8 ^ 0x11));
                  pjVar12 = (jx9_expr_op *)((long)&aOpTable[0].sOp.zString + lVar23);
                  pjVar5->pOp = pjVar12;
                  apNode[uVar24]->pStart->pUserData = pjVar12;
                }
              }
              else {
                iVar10 = iVar10 + 1;
              }
            }
            else {
              if (iVar18 < 1) {
                pcVar15 = "Syntax error: Unexpected token \']\'";
                goto LAB_00122781;
              }
              iVar18 = iVar18 + -1;
            }
          }
          else {
            iVar18 = iVar18 + 1;
          }
        }
        else {
          if (iVar20 < 1) {
            pcVar15 = "Syntax error: Unexpected token \')\'";
            goto LAB_00122781;
          }
          iVar20 = iVar20 + -1;
        }
      }
      else {
        if (((uVar24 != 0) &&
            (p_Var6 = apNode[uVar24 - 1]->xCode, uVar2 = apNode[uVar24 - 1]->pStart->nType,
            (uVar2 & 0x740c) != 0 || (p_Var6 == jx9CompileLiteral || p_Var6 == jx9CompileVariable)))
           && ((uVar2 & 0x20) == 0)) {
          pSVar11->nType = uVar22 | 0x20;
          pSVar11->pUserData = &sFCallOp;
          apNode[uVar24]->pOp = &sFCallOp;
        }
        iVar20 = iVar20 + 1;
      }
    }
    if ((iVar20 != 0 || iVar18 != 0) || iVar10 != 0) {
      pSVar11 = (*apNode)->pStart;
      pcVar15 = "Syntax error, mismatched \'(\', \'[\' or \'{\'";
LAB_00122781:
      sVar9 = jx9GenCompileError(pGen,1,pSVar11->nLine,pcVar15);
      uVar22 = (uint)(sVar9 == -10) * 2 | 0xfffffff4;
      goto LAB_001227a6;
    }
    uVar22 = ExprMakeTree(pGen,apNode,sVar16);
    if (uVar22 != 0) goto LAB_001227a6;
    pjVar5 = *apNode;
    if (pjVar5 == (jx9_expr_node *)0x0) {
      local_7c = 0;
      local_94 = 0;
    }
    else if ((local_60 == (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0) ||
            (sVar9 = (*local_60)(pGen,pjVar5), sVar9 != -10)) {
      local_94 = GenStateEmitExprCode(pGen,pjVar5,local_6c);
    }
  }
  for (uVar24 = 0; sVar16 != uVar24; uVar24 = uVar24 + 1) {
    if (apNode[uVar24] != (jx9_expr_node *)0x0) {
      ExprFreeTree(pGen,apNode[uVar24]);
    }
  }
  pGen->pEnd = pSVar3;
  pGen->pIn = pSVar21;
  iVar10 = local_7c;
  if (local_94 == 0xfffffff6) {
    SySetRelease(&local_58);
    return -10;
  }
LAB_001227fd:
  SySetRelease(&local_58);
  return (uint)(0 < iVar10) * 3 + -3;
}

Assistant:

static sxi32 jx9CompileExpr(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags,        /* Control flags */
	sxi32 (*xTreeValidator)(jx9_gen_state *, jx9_expr_node *) /* Node validator callback.NULL otherwise */
	)
{
	jx9_expr_node *pRoot;
	SySet sExprNode;
	SyToken *pEnd;
	sxi32 nExpr;
	sxi32 iNest;
	sxi32 rc;
	/* Initialize worker variables */
	nExpr = 0;
	pRoot = 0;
	SySetInit(&sExprNode, &pGen->pVm->sAllocator, sizeof(jx9_expr_node *));
	SySetAlloc(&sExprNode, 0x10);
	rc = SXRET_OK;
	/* Delimit the expression */
	pEnd = pGen->pIn;
	iNest = 0;
	while( pEnd < pGen->pEnd ){
		if( pEnd->nType & JX9_TK_OCB /* '{' */ ){
			/* Ticket 1433-30: Annonymous/Closure functions body */
			iNest++;
		}else if(pEnd->nType & JX9_TK_CCB /* '}' */ ){
			iNest--;
		}else if( pEnd->nType & JX9_TK_SEMI /* ';' */ ){
			if( iNest <= 0 ){
				break;
			}
		}
		pEnd++;
	}
	if( iFlags & EXPR_FLAG_COMMA_STATEMENT ){
		SyToken *pEnd2 = pGen->pIn;
		iNest = 0;
		/* Stop at the first comma */
		while( pEnd2 < pEnd ){
			if( pEnd2->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_OSB/*'['*/|JX9_TK_LPAREN/*'('*/) ){
				iNest++;
			}else if(pEnd2->nType & (JX9_TK_CCB/*'}'*/|JX9_TK_CSB/*']'*/|JX9_TK_RPAREN/*')'*/)){
				iNest--;
			}else if( pEnd2->nType & JX9_TK_COMMA /*','*/ ){
				if( iNest <= 0 ){
					break;
				}
			}
			pEnd2++;
		}
		if( pEnd2 <pEnd ){
			pEnd = pEnd2;
		}
	}
	if( pEnd > pGen->pIn ){
		SyToken *pTmp = pGen->pEnd;
		/* Swap delimiter */
		pGen->pEnd = pEnd;
		/* Try to get an expression tree */
		rc = jx9ExprMakeTree(&(*pGen), &sExprNode, &pRoot);
		if( rc == SXRET_OK && pRoot ){
			rc = SXRET_OK;
			if( xTreeValidator ){
				/* Call the upper layer validator callback */
				rc = xTreeValidator(&(*pGen), pRoot);
			}
			if( rc != SXERR_ABORT ){
				/* Generate code for the given tree */
				rc = GenStateEmitExprCode(&(*pGen), pRoot, iFlags);
			}
			nExpr = 1;
		}
		/* Release the whole tree */
		jx9ExprFreeTree(&(*pGen), &sExprNode);
		/* Synchronize token stream */
		pGen->pEnd = pTmp;
		pGen->pIn  = pEnd;
		if( rc == SXERR_ABORT ){
			SySetRelease(&sExprNode);
			return SXERR_ABORT;
		}
	}
	SySetRelease(&sExprNode);
	return nExpr > 0 ? SXRET_OK : SXERR_EMPTY;
}